

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  Vdbe *p;
  Expr *pEVar4;
  ExprList *pEVar5;
  Vdbe *pVVar6;
  SubrtnSig *pSVar7;
  u8 uVar8;
  uint uVar9;
  int iVar10;
  int target;
  int p3;
  int iVar11;
  KeyInfo *p_00;
  CollSeq *pCVar12;
  Select *pSVar13;
  Expr *pLeft;
  int iVar14;
  char *pcVar15;
  Op *pOVar16;
  ulong uVar17;
  sqlite3 *psVar18;
  ulong uVar19;
  ExprList_item *pEVar20;
  Op *pOVar21;
  ExprList **ppEVar22;
  long in_FS_OFFSET;
  bool bVar23;
  int local_b0;
  int local_98;
  uint *local_90;
  SelectDest local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  if (((pExpr->flags & 0x40) == 0) && (pParse->iSelfTab == 0)) {
    if ((((pExpr->flags >> 0xc & 1) == 0) || ((((pExpr->x).pList)->nAlloc & 2) != 0)) ||
       (local_90 = (uint *)sqlite3DbMallocRawNN(pParse->db,0x20), local_90 == (uint *)0x0)) {
      local_90 = (uint *)0x0;
    }
    else {
      *local_90 = ((pExpr->x).pSelect)->selId;
      pcVar15 = exprINAffinity(pParse,pExpr);
      *(char **)(local_90 + 2) = pcVar15;
    }
    uVar9 = pExpr->flags;
    if ((uVar9 >> 0x19 & 1) == 0) {
      if ((local_90 != (uint *)0x0) &&
         (uVar3 = *local_90, (pParse->mSubrtnSig >> (uVar3 & 7) & 1) != 0)) {
        pVVar6 = pParse->pVdbe;
        if (pVVar6->db->mallocFailed == '\0') {
          pOVar16 = pVVar6->aOp;
          pOVar21 = pOVar16 + (long)pVVar6->nOp + -1;
          goto LAB_00176800;
        }
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
        for (pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy; pOVar16 < pOVar21; pOVar16 = pOVar16 + 1) {
          if (((pOVar16->p4type == -0x11) &&
              (pSVar7 = (pOVar16->p4).pSubrtnSig, pSVar7->bComplete != '\0')) &&
             ((uVar3 == pSVar7->selId &&
              (iVar10 = strcmp(*(char **)(local_90 + 2),pSVar7->zAff), iVar10 == 0)))) {
            (pExpr->y).sub.iAddr = pSVar7->iAddr;
            (pExpr->y).sub.regReturn = pSVar7->regReturn;
            pExpr->iTable = pSVar7->iTable;
            pExpr->flags = uVar9 | 0x2000000;
            goto LAB_0017686d;
          }
LAB_00176800:
        }
      }
      pExpr->flags = uVar9 | 0x2000000;
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
      (pExpr->y).sub.regReturn = iVar10;
      iVar10 = sqlite3VdbeAddOp2(p,0x4a,0,iVar10);
      (pExpr->y).sub.iAddr = iVar10 + 1;
      if (local_90 != (uint *)0x0) {
        *(byte *)(local_90 + 1) = 0;
        local_90[5] = (pExpr->y).sub.iAddr;
        local_90[6] = (pExpr->y).sub.regReturn;
        local_90[4] = iTab;
        pParse->mSubrtnSig = (u8)(1 << ((byte)*local_90 & 7));
        sqlite3VdbeChangeP4(p,-1,(char *)local_90,-0x11);
      }
      local_98 = sqlite3VdbeAddOp0(p,0xf);
      goto LAB_001762bf;
    }
LAB_0017686d:
    iVar10 = sqlite3VdbeAddOp0(p,0xf);
    if ((pExpr->flags & 0x1000) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
    }
    sqlite3VdbeAddOp2(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
    sqlite3VdbeAddOp2(p,0x72,iTab,pExpr->iTable);
    sqlite3VdbeJumpHere(p,iVar10);
    if (local_90 != (uint *)0x0) {
      sqlite3DbFree(pParse->db,*(void **)(local_90 + 2));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3DbFreeNN(pParse->db,local_90);
        return;
      }
      goto LAB_0017699f;
    }
  }
  else {
    local_90 = (uint *)0x0;
    local_98 = 0;
LAB_001762bf:
    pEVar4 = pExpr->pLeft;
    uVar9 = sqlite3ExprVectorSize(pEVar4);
    pExpr->iTable = iTab;
    iVar10 = sqlite3VdbeAddOp2(p,0x75,iTab,uVar9);
    p_00 = sqlite3KeyInfoAlloc(pParse->db,uVar9,1);
    pSVar13 = (pExpr->x).pSelect;
    if ((pExpr->flags & 0x1000) == 0) {
      if (pSVar13 != (Select *)0x0) {
        uVar8 = sqlite3ExprAffinity(pEVar4);
        local_68.eDest = uVar8;
        if ((char)uVar8 < 'A') {
          local_68.eDest = 'A';
        }
        else if (uVar8 == 'E') {
          local_68.eDest = 'C';
        }
        if (p_00 != (KeyInfo *)0x0) {
          pCVar12 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
          p_00->aColl[0] = pCVar12;
        }
        target = sqlite3GetTempReg(pParse);
        p3 = sqlite3GetTempReg(pParse);
        iVar14._0_1_ = pSVar13->op;
        iVar14._1_1_ = pSVar13->field_0x1;
        iVar14._2_2_ = pSVar13->nSelectRow;
        ppEVar22 = (ExprList **)&pSVar13->iLimit;
        for (; 0 < iVar14; iVar14 = iVar14 + -1) {
          pEVar4 = (Expr *)*ppEVar22;
          if (local_98 == 0) {
            local_98 = 0;
          }
          else {
            iVar11 = sqlite3ExprIsConstant(pParse,pEVar4);
            if (iVar11 == 0) {
              sqlite3VdbeChangeToNoop(p,local_98 + -1);
              sqlite3VdbeChangeToNoop(p,local_98);
              pbVar1 = (byte *)((long)&pExpr->flags + 3);
              *pbVar1 = *pbVar1 & 0xfd;
              local_98 = 0;
            }
          }
          sqlite3ExprCode(pParse,pEVar4,target);
          sqlite3VdbeAddOp4(p,0x61,target,1,p3,(char *)&local_68,1);
          sqlite3VdbeAddOp4Int(p,0x8a,iTab,p3,target,1);
          ppEVar22 = ppEVar22 + 3;
        }
        if (target != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = target;
          }
        }
        if (p3 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = p3;
          }
        }
      }
    }
    else {
      pEVar5 = pSVar13->pEList;
      pcVar15 = "";
      if (local_98 == 0) {
        pcVar15 = "CORRELATED ";
      }
      local_b0 = 0;
      sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar15,(ulong)pSVar13->selId);
      if (pEVar5->nExpr == uVar9) {
        local_68.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
        local_68.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.iSDParm = iTab;
        local_68._0_4_ = 0xaaaaaa0b;
        local_68.iSDParm2 = 0;
        local_68.iSdst = 0;
        local_68.nSdst = 0;
        local_68._20_4_ = 0xaaaaaaaa;
        local_68.zAffSdst = exprINAffinity(pParse,pExpr);
        pSVar13->iLimit = 0;
        psVar18 = pParse->db;
        if ((local_98 != 0) && ((psVar18->dbOptFlags & 0x80000) == 0)) {
          iVar14 = pParse->nMem + 1;
          pParse->nMem = iVar14;
          local_b0 = sqlite3VdbeAddOp2(p,0x4d,10000,iVar14);
          local_68.iSDParm2 = iVar14;
          psVar18 = pParse->db;
        }
        bVar23 = false;
        pSVar13 = sqlite3SelectDup(psVar18,pSVar13,0);
        psVar18 = pParse->db;
        if (psVar18->mallocFailed == '\0') {
          iVar14 = sqlite3Select(pParse,pSVar13,&local_68);
          bVar23 = iVar14 == 0;
          psVar18 = pParse->db;
        }
        sqlite3SelectDelete(psVar18,pSVar13);
        sqlite3DbFree(pParse->db,local_68.zAffSdst);
        if (local_b0 != 0) {
          if (p->db->mallocFailed == '\0') {
            pOVar16 = p->aOp;
            pOVar16[local_98].p3 = local_68.iSDParm2;
            if (local_68.iSDParm2 == 0) goto LAB_001766ef;
            pOVar16 = pOVar16 + local_98;
          }
          else {
            DAT_0022f34c = local_68.iSDParm2;
            if (local_68.iSDParm2 == 0) {
LAB_001766ef:
              sqlite3VdbeChangeToNoop(p,local_b0);
              goto LAB_001766f4;
            }
            pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar16->p3 = local_68.iSDParm2;
        }
LAB_001766f4:
        if (!bVar23) {
          sqlite3KeyInfoUnref(p_00);
          goto LAB_001767bd;
        }
        pEVar20 = pEVar5->a;
        uVar17 = 0;
        uVar19 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar19 = uVar17;
        }
        for (; uVar19 != uVar17; uVar17 = uVar17 + 1) {
          pLeft = sqlite3VectorFieldSubexpr(pEVar4,(int)uVar17);
          pCVar12 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar20->pExpr);
          p_00->aColl[uVar17] = pCVar12;
          pEVar20 = pEVar20 + 1;
        }
      }
    }
    if (local_90 != (uint *)0x0) {
      *(byte *)(local_90 + 1) = 1;
    }
    if (p_00 != (KeyInfo *)0x0) {
      sqlite3VdbeChangeP4(p,iVar10,(char *)p_00,-8);
    }
    if (local_98 != 0) {
      sqlite3VdbeAddOp1(p,0x88,iTab);
      sqlite3VdbeJumpHere(p,local_98);
      sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
      pParse->nTempReg = '\0';
      pParse->nRangeReg = 0;
    }
  }
LAB_001767bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0017699f:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */
  SubrtnSig *pSig = 0;        /* Signature for this subroutine */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed
    **
    ** Compute a signature for the RHS of the IN operator to facility
    ** finding and reusing prior instances of the same IN operator.
    */
    assert( !ExprUseXSelect(pExpr) || pExpr->x.pSelect!=0 );
    if( ExprUseXSelect(pExpr) && (pExpr->x.pSelect->selFlags & SF_All)==0 ){
      pSig = sqlite3DbMallocRawNN(pParse->db, sizeof(pSig[0]));
      if( pSig ){
        pSig->selId = pExpr->x.pSelect->selId;
        pSig->zAff = exprINAffinity(pParse, pExpr);
      }
    }

    /* Check to see if there is a prior materialization of the RHS of
    ** this IN operator.  If there is, then make use of that prior
    ** materialization rather than recomputing it.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn)
     || findCompatibleInRhsSubrtn(pParse, pExpr, pSig)
    ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      if( pSig ){
        sqlite3DbFree(pParse->db, pSig->zAff);
        sqlite3DbFree(pParse->db, pSig);
      }
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;
    if( pSig ){
      pSig->bComplete = 0;
      pSig->iAddr = pExpr->y.sub.iAddr;
      pSig->regReturn = pExpr->y.sub.regReturn;
      pSig->iTable = iTab;
      pParse->mSubrtnSig = 1 << (pSig->selId&7);
      sqlite3VdbeChangeP4(v, -1, (const char*)pSig, P4_SUBRTNSIG);
    }
    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      int addrBloom = 0;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      if( addrOnce && OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
        int regBloom = ++pParse->nMem;
        addrBloom = sqlite3VdbeAddOp2(v, OP_Blob, 10000, regBloom);
        VdbeComment((v, "Bloom filter"));
        dest.iSDParm2 = regBloom;
      }
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( addrBloom ){
        sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        if( dest.iSDParm2==0 ){
          sqlite3VdbeChangeToNoop(v, addrBloom);
        }else{
          sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        }
      }
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pParse, pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pSig ) pSig->bComplete = 1;
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}